

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O0

TPZGeoMesh * __thiscall
TPZAcademicGeoMesh::RedBlackPyramidalAndHexagonalMesh(TPZAcademicGeoMesh *this)

{
  _func_int **pp_Var1;
  double dVar2;
  double dVar3;
  int iVar4;
  TPZGeoMesh *pTVar5;
  int *piVar6;
  TPZGeoNode *pTVar7;
  long *plVar8;
  long lVar9;
  int iVar10;
  long in_RDI;
  int inode_1;
  int64_t index_1;
  TPZManVector<long,_8> el_nodes_1;
  TPZManVector<long,_5> el_nodes;
  int64_t index;
  int center_id;
  int i_1;
  TPZManVector<double,_3> x;
  int inode;
  TPZManVector<long,_8> nodes;
  bool is_even_Q;
  int l;
  int stride;
  int i;
  int j;
  int k;
  TPZManVector<int,_8> indexes;
  TPZStack<int,_10> perm;
  int64_t n_nodes;
  REAL dx;
  REAL dir;
  int64_t s;
  TPZGeoMesh *gmesh;
  int MaterialId;
  int64_t n;
  int in_stack_fffffffffffff9bc;
  TPZGeoMesh *in_stack_fffffffffffff9c0;
  TPZVec<double> *in_stack_fffffffffffff9c8;
  TPZGeoNode *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9dc;
  TPZChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffff9e0;
  TPZGeoMesh *in_stack_fffffffffffff9f0;
  long *in_stack_fffffffffffffa48;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffa50;
  TPZGeoMesh *in_stack_fffffffffffffa68;
  TPZAcademicGeoMesh *in_stack_fffffffffffffa70;
  TPZGeoMesh *in_stack_fffffffffffffaa8;
  TPZAcademicGeoMesh *in_stack_fffffffffffffab0;
  TPZGeoMesh *in_stack_fffffffffffffce0;
  int local_254;
  undefined1 local_250 [8];
  TPZVec<long> local_248 [3];
  TPZVec<long> local_1e8 [2];
  undefined1 local_1a0 [8];
  int local_198;
  int local_194;
  TPZVec<double> local_190;
  TPZGeoMesh *in_stack_fffffffffffffe98;
  TPZAcademicGeoMesh *in_stack_fffffffffffffea0;
  int local_154;
  TPZVec<long> local_150 [3];
  undefined1 local_ed;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  TPZVec<int> local_d8 [2];
  TPZVec<int> local_98 [2];
  int64_t local_50;
  double local_48;
  double local_40;
  long local_38;
  TPZGeoMesh *local_20;
  uint local_14;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0x2f0);
  local_14 = *(uint *)(in_RDI + 0x2f8);
  pTVar5 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(in_stack_fffffffffffff9f0);
  local_20 = pTVar5;
  GenerateNodes(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  TPZGeoMesh::SetDimension(local_20,3);
  local_38 = local_10 + 1;
  local_40 = 1.0;
  local_48 = 0.5 / (double)local_10;
  local_50 = TPZGeoMesh::NNodes((TPZGeoMesh *)0x1e2bbe2);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_fffffffffffff9d0);
  TPZStack<int,_10>::push_back
            ((TPZStack<int,_10> *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
  TPZStack<int,_10>::push_back
            ((TPZStack<int,_10> *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
  TPZStack<int,_10>::push_back
            ((TPZStack<int,_10> *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
  TPZStack<int,_10>::push_back
            ((TPZStack<int,_10> *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
  TPZStack<int,_10>::push_back
            ((TPZStack<int,_10> *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
  TPZStack<int,_10>::push_back
            ((TPZStack<int,_10> *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
  TPZStack<int,_10>::push_back
            ((TPZStack<int,_10> *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
  TPZStack<int,_10>::push_back
            ((TPZStack<int,_10> *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
  TPZManVector<int,_8>::TPZManVector
            ((TPZManVector<int,_8> *)in_stack_fffffffffffff9e0,
             CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
  for (local_dc = 0; local_dc < local_10; local_dc = local_dc + 1) {
    for (local_e0 = 0; local_e0 < local_10; local_e0 = local_e0 + 1) {
      for (local_e4 = 0; local_e4 < local_10; local_e4 = local_e4 + 1) {
        local_e8 = local_e0 * (int)local_38 + local_dc * (int)local_38 * (int)local_38;
        iVar4 = local_e4 + local_e8;
        piVar6 = TPZVec<int>::operator[](local_d8,0);
        *piVar6 = iVar4;
        iVar4 = local_e4 + 1 + local_e8;
        piVar6 = TPZVec<int>::operator[](local_d8,1);
        *piVar6 = iVar4;
        iVar4 = local_e4 + (int)local_38 + local_e8;
        piVar6 = TPZVec<int>::operator[](local_d8,2);
        *piVar6 = iVar4;
        iVar10 = local_e4 + (int)local_38;
        iVar4 = local_e8 + 1;
        piVar6 = TPZVec<int>::operator[](local_d8,3);
        *piVar6 = iVar4 + iVar10;
        for (local_ec = 0; local_ec < 4; local_ec = local_ec + 1) {
          piVar6 = TPZVec<int>::operator[](local_d8,(long)local_ec);
          iVar4 = *piVar6;
          iVar10 = (int)local_38 * (int)local_38;
          piVar6 = TPZVec<int>::operator[](local_d8,(long)(local_ec + 4));
          *piVar6 = iVar4 + iVar10;
        }
        local_ed = (local_e4 + local_e0 + local_dc) % 2 == 0;
        if ((bool)local_ed) {
          TPZManVector<long,_8>::TPZManVector
                    ((TPZManVector<long,_8> *)in_stack_fffffffffffff9e0,
                     CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          for (local_154 = 0; local_154 < 8; local_154 = local_154 + 1) {
            TPZGeoMesh::NodeVec(local_20);
            piVar6 = TPZVec<int>::operator[](local_98,(long)local_154);
            TPZVec<int>::operator[](local_d8,(long)*piVar6);
            pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               (in_stack_fffffffffffff9e0,
                                CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
            iVar4 = TPZGeoNode::Id(pTVar7);
            plVar8 = TPZVec<long>::operator[](local_150,(long)local_154);
            *plVar8 = (long)iVar4;
          }
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff9e0,
                     CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          TPZGeoMesh::NodeVec(local_20);
          TPZVec<long>::operator[](local_150,0);
          TPZChunkVector<TPZGeoNode,_10>::operator[]
                    (in_stack_fffffffffffff9e0,
                     CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          TPZGeoNode::GetCoordinates(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
          for (local_194 = 0; dVar3 = local_40, dVar2 = local_48,
              iVar4 = (int)((ulong)in_stack_fffffffffffffa48 >> 0x20), local_194 < 3;
              local_194 = local_194 + 1) {
            in_stack_fffffffffffffce0 =
                 (TPZGeoMesh *)TPZVec<double>::operator[](&local_190,(long)local_194);
            (in_stack_fffffffffffffce0->super_TPZSavable)._vptr_TPZSavable =
                 (_func_int **)
                 (dVar2 * dVar3 +
                 (double)(in_stack_fffffffffffffce0->super_TPZSavable)._vptr_TPZSavable);
          }
          TPZGeoMesh::NodeVec(local_20);
          TPZAdmChunkVector<TPZGeoNode,_10>::Resize(in_stack_fffffffffffffa50,iVar4);
          TPZGeoMesh::NodeVec(local_20);
          TPZChunkVector<TPZGeoNode,_10>::operator[]
                    (in_stack_fffffffffffff9e0,
                     CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          TPZGeoNode::Initialize
                    (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
          TPZGeoMesh::NodeVec(local_20);
          pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (in_stack_fffffffffffff9e0,
                              CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          local_198 = TPZGeoNode::Id(pTVar7);
          local_50 = local_50 + 1;
          TPZManVector<long,_5>::TPZManVector
                    ((TPZManVector<long,_5> *)in_stack_fffffffffffff9e0,
                     CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          plVar8 = TPZVec<long>::operator[](local_150,0);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,0);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,1);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,1);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,2);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,2);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,3);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,3);
          *plVar8 = lVar9;
          lVar9 = (long)local_198;
          plVar8 = TPZVec<long>::operator[](local_1e8,4);
          *plVar8 = lVar9;
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (local_20,5,local_1e8,(ulong)local_14,local_1a0,1);
          plVar8 = TPZVec<long>::operator[](local_150,0);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,0);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,3);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,1);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,7);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,2);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,4);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,3);
          *plVar8 = lVar9;
          lVar9 = (long)local_198;
          plVar8 = TPZVec<long>::operator[](local_1e8,4);
          *plVar8 = lVar9;
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (local_20,5,local_1e8,(ulong)local_14,local_1a0,1);
          plVar8 = TPZVec<long>::operator[](local_150,0);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,0);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,1);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,1);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,5);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,2);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,4);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,3);
          *plVar8 = lVar9;
          lVar9 = (long)local_198;
          plVar8 = TPZVec<long>::operator[](local_1e8,4);
          *plVar8 = lVar9;
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (local_20,5,local_1e8,(ulong)local_14,local_1a0,1);
          plVar8 = TPZVec<long>::operator[](local_150,1);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,0);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,2);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,1);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,6);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,2);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,5);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,3);
          *plVar8 = lVar9;
          lVar9 = (long)local_198;
          plVar8 = TPZVec<long>::operator[](local_1e8,4);
          *plVar8 = lVar9;
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (local_20,5,local_1e8,(ulong)local_14,local_1a0,1);
          plVar8 = TPZVec<long>::operator[](local_150,3);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,0);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,2);
          in_stack_fffffffffffffab0 = (TPZAcademicGeoMesh *)*plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,1);
          *plVar8 = (long)in_stack_fffffffffffffab0;
          in_stack_fffffffffffffaa8 = (TPZGeoMesh *)TPZVec<long>::operator[](local_150,6);
          pp_Var1 = (in_stack_fffffffffffffaa8->super_TPZSavable)._vptr_TPZSavable;
          plVar8 = TPZVec<long>::operator[](local_1e8,2);
          *plVar8 = (long)pp_Var1;
          plVar8 = TPZVec<long>::operator[](local_150,7);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,3);
          *plVar8 = lVar9;
          lVar9 = (long)local_198;
          plVar8 = TPZVec<long>::operator[](local_1e8,4);
          *plVar8 = lVar9;
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (local_20,5,local_1e8,(ulong)local_14,local_1a0,1);
          plVar8 = TPZVec<long>::operator[](local_150,4);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,0);
          *plVar8 = lVar9;
          in_stack_fffffffffffffa50 =
               (TPZAdmChunkVector<TPZGeoNode,_10> *)TPZVec<long>::operator[](local_150,5);
          pp_Var1 = (in_stack_fffffffffffffa50->super_TPZChunkVector<TPZGeoNode,_10>).
                    super_TPZSavable._vptr_TPZSavable;
          in_stack_fffffffffffffa48 = TPZVec<long>::operator[](local_1e8,1);
          *in_stack_fffffffffffffa48 = (long)pp_Var1;
          plVar8 = TPZVec<long>::operator[](local_150,6);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,2);
          *plVar8 = lVar9;
          plVar8 = TPZVec<long>::operator[](local_150,7);
          lVar9 = *plVar8;
          plVar8 = TPZVec<long>::operator[](local_1e8,3);
          *plVar8 = lVar9;
          lVar9 = (long)local_198;
          plVar8 = TPZVec<long>::operator[](local_1e8,4);
          *plVar8 = lVar9;
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (local_20,5,local_1e8,(ulong)local_14,local_1a0,1);
          TPZManVector<long,_5>::~TPZManVector((TPZManVector<long,_5> *)in_stack_fffffffffffff9c0);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff9c0);
          TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)in_stack_fffffffffffff9c0);
        }
        else {
          TPZManVector<long,_8>::TPZManVector
                    ((TPZManVector<long,_8> *)in_stack_fffffffffffff9e0,
                     CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          for (local_254 = 0; local_254 < 8; local_254 = local_254 + 1) {
            TPZGeoMesh::NodeVec(local_20);
            piVar6 = TPZVec<int>::operator[](local_98,(long)local_254);
            TPZVec<int>::operator[](local_d8,(long)*piVar6);
            in_stack_fffffffffffff9e0 =
                 (TPZChunkVector<TPZGeoNode,_10> *)
                 TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (in_stack_fffffffffffff9e0,
                            CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
            in_stack_fffffffffffff9dc = TPZGeoNode::Id((TPZGeoNode *)in_stack_fffffffffffff9e0);
            in_stack_fffffffffffff9c8 = (TPZVec<double> *)(long)in_stack_fffffffffffff9dc;
            in_stack_fffffffffffff9d0 =
                 (TPZGeoNode *)TPZVec<long>::operator[](local_248,(long)local_254);
            (((TPZManVector<int,_10> *)&in_stack_fffffffffffff9d0->super_TPZSavable)->
            super_TPZVec<int>)._vptr_TPZVec = (_func_int **)in_stack_fffffffffffff9c8;
          }
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0xc])
                    (local_20,7,local_248,(ulong)local_14,local_250,1);
          TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)in_stack_fffffffffffff9c0);
        }
      }
    }
  }
  TPZGeoMesh::BuildConnectivity(in_stack_fffffffffffffce0);
  AddBoundaryElements(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if ((*(byte *)(in_RDI + 0x2e8) & 1) != 0) {
    DeformGMesh(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  }
  pTVar5 = local_20;
  TPZManVector<int,_8>::~TPZManVector((TPZManVector<int,_8> *)local_20);
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1e2d0da);
  return pTVar5;
}

Assistant:

TPZGeoMesh *TPZAcademicGeoMesh::RedBlackPyramidalAndHexagonalMesh(){
    
    int64_t n = fNumberElements;
    int MaterialId = fMaterialId;
    TPZGeoMesh *gmesh = new TPZGeoMesh;
    GenerateNodes(gmesh);
    gmesh->SetDimension(3);
    
    int64_t s = n + 1;
    REAL dir = 1.0;
    REAL dx = 0.5/n;
    int64_t n_nodes = gmesh->NNodes();
    TPZStack<int> perm;
    perm.push_back(0);
    perm.push_back(1);
    perm.push_back(3);
    perm.push_back(2);
    perm.push_back(4);
    perm.push_back(5);
    perm.push_back(7);
    perm.push_back(6);
    
    TPZManVector<int,8> indexes(8);
    for (int k = 0; k < n; k++) {
        for (int j = 0; j < n; j++) {
            for (int i = 0; i < n; i++) {
                
                int stride =  j*s + k*s*s;
                indexes[0] = i + stride;
                indexes[1] = i + 1 + stride;
                indexes[2] = i + s + stride;
                indexes[3] = i + 1 + s + stride;
                for (int l = 0; l < 4; l++) { // Vertical stride
                    indexes[l+4] = indexes[l]+s*s;
                }
                
                bool is_even_Q = (i+j+k)%2==0;
                if (is_even_Q) {
                    
                    TPZManVector<int64_t,8> nodes(8);
                    for (int inode=0; inode<8; inode++) {
                        nodes[inode] = gmesh->NodeVec()[indexes[perm[inode]]].Id();
                    }
                    
                    // Adding center point
                    TPZManVector<REAL,3> x(3);
                    gmesh->NodeVec()[nodes[0]].GetCoordinates(x);
                    for (int i = 0; i < 3; i++) {
                        x[i]+=dx*dir;
                    }
                    
                    gmesh->NodeVec().Resize(n_nodes+1);
                    gmesh->NodeVec()[n_nodes].Initialize(x, *gmesh);
                    int center_id = gmesh->NodeVec()[n_nodes].Id();
                    n_nodes++;
                    
                    // inserting Pyramids
                    int64_t index;
                    TPZManVector<int64_t,5> el_nodes(5);
                    
                    el_nodes[0] = nodes[0];
                    el_nodes[1] = nodes[1];
                    el_nodes[2] = nodes[2];
                    el_nodes[3] = nodes[3];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[0];
                    el_nodes[1] = nodes[3];
                    el_nodes[2] = nodes[7];
                    el_nodes[3] = nodes[4];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[0];
                    el_nodes[1] = nodes[1];
                    el_nodes[2] = nodes[5];
                    el_nodes[3] = nodes[4];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[1];
                    el_nodes[1] = nodes[2];
                    el_nodes[2] = nodes[6];
                    el_nodes[3] = nodes[5];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[3];
                    el_nodes[1] = nodes[2];
                    el_nodes[2] = nodes[6];
                    el_nodes[3] = nodes[7];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    el_nodes[0] = nodes[4];
                    el_nodes[1] = nodes[5];
                    el_nodes[2] = nodes[6];
                    el_nodes[3] = nodes[7];
                    el_nodes[4] = center_id;
                    gmesh->CreateGeoElement(EPiramide, el_nodes, MaterialId, index);
                    
                    
                }else{
                    TPZManVector<int64_t,8> el_nodes(8);
                    int64_t index;
                    for (int inode=0; inode<8; inode++) {
                        el_nodes[inode] = gmesh->NodeVec()[indexes[perm[inode]]].Id();
                    }
                    gmesh->CreateGeoElement(ECube, el_nodes, MaterialId, index);
                }
                
            }
        }
    }
    
    gmesh->BuildConnectivity();
    AddBoundaryElements(gmesh);
    if (fShouldDeform) {
        DeformGMesh(*gmesh);
    }
    
    return gmesh;
}